

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderingParameters.hpp
# Opt level: O2

Matrix4f * __thiscall
eos::fitting::RenderingParameters::get_projection
          (Matrix4f *__return_storage_ptr__,RenderingParameters *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  float *pfVar3;
  Matrix4<float> *ortho;
  
  if (this->camera_type == Orthographic) {
    render::ortho<float>
              (__return_storage_ptr__,(this->frustum).l,(this->frustum).r,(this->frustum).b,
               (this->frustum).t);
  }
  else {
    if ((this->fov_y).super__Optional_base<float,_true,_true>._M_payload.
        super__Optional_payload_base<float>._M_engaged == false) {
      __assert_fail("fov_y.has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/RenderingParameters.hpp"
                    ,0xfd,
                    "Eigen::Matrix4f eos::fitting::RenderingParameters::get_projection() const");
    }
    uVar1 = this->screen_width;
    uVar2 = this->screen_height;
    pfVar3 = std::optional<float>::value(&this->fov_y);
    render::perspective<float>
              (__return_storage_ptr__,*pfVar3,(float)(int)uVar1 / (float)(int)uVar2,0.1,1000.0);
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix4f get_projection() const
    {
        if (camera_type == CameraType::Orthographic)
        {
            const auto ortho = render::ortho(frustum.l, frustum.r, frustum.b, frustum.t);
            return ortho;
        } else
        {
            assert(fov_y.has_value()); // Might be worth throwing an exception instead.
            const float aspect_ratio = static_cast<double>(screen_width) / screen_height;
            const auto persp_mtx = render::perspective(fov_y.value(), aspect_ratio, 0.1f, 1000.0f);
            return persp_mtx;
        }
    }